

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_search.hpp
# Opt level: O2

void __thiscall
pico_tree::internal::
search_nearest_euclidean<pico_tree::internal::space_wrapper<std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>_>,_metric_lp_p<3UL>,_pico_tree::internal::point_wrapper<pico_tree::point<float,_2UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
::search_nearest(search_nearest_euclidean<pico_tree::internal::space_wrapper<std::vector<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>_>,_metric_lp_p<3UL>,_pico_tree::internal::point_wrapper<pico_tree::point<float,_2UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_float>_>,_int>
                 *this,node_type *node,scalar_type node_box_distance)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  kd_tree_node_euclidean<int,_float> *pkVar5;
  pointer piVar6;
  search_nn<pico_tree::neighbor<int,_float>_> *psVar7;
  point_type *begin1;
  neighbor_type *pnVar8;
  kd_tree_node_euclidean<int,_float> *node_00;
  int *piVar9;
  kd_tree_node_euclidean<int,_float> *node_01;
  scalar_type sVar10;
  float fVar11;
  float node_box_distance_00;
  float fVar12;
  
  node_00 = (node->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>
            ).left;
  pkVar5 = (node->super_kd_tree_node_base<pico_tree::internal::kd_tree_node_euclidean<int,_float>_>)
           .right;
  if (node_00 == (kd_tree_node_euclidean<int,_float> *)0x0 &&
      pkVar5 == (kd_tree_node_euclidean<int,_float> *)0x0) {
    piVar6 = (this->indices_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar3 = (node->data).leaf.end_idx;
    for (piVar9 = piVar6 + (node->data).branch.split_dim; piVar9 < piVar6 + iVar3;
        piVar9 = piVar9 + 1) {
      psVar7 = this->visitor_;
      iVar4 = *piVar9;
      begin1 = (this->query_).point_;
      sVar10 = metric_lp_p<3ul>::operator()
                         ((metric_lp_p<3ul> *)&this->field_0x8,(float *)begin1,(float *)(begin1 + 1)
                          ,(float *)((((this->space_).space_)->
                                     super__Vector_base<pico_tree::point<float,_2UL>,_std::allocator<pico_tree::point<float,_2UL>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + iVar4));
      pnVar8 = psVar7->nn_;
      if (sVar10 < pnVar8->distance) {
        pnVar8->index = iVar4;
        pnVar8->distance = sVar10;
      }
    }
  }
  else {
    iVar3 = (node->data).branch.split_dim;
    fVar1 = (((this->query_).point_)->super_point<float,_2UL>).elems_._M_elems[iVar3];
    fVar2 = (node->data).branch.left_max;
    fVar11 = (node->data).branch.right_min;
    fVar12 = (fVar2 + fVar11) - fVar1;
    node_01 = pkVar5;
    if (fVar1 < fVar12) {
      node_01 = node_00;
    }
    fVar11 = powf(ABS((float)(~-(uint)(fVar1 < fVar12) & (uint)fVar2 |
                             (uint)fVar11 & -(uint)(fVar1 < fVar12)) - fVar1),3.0);
    search_nearest(this,node_01,node_box_distance);
    fVar2 = (this->node_box_offset_).elems_._M_elems[iVar3];
    node_box_distance_00 = (node_box_distance - fVar2) + fVar11;
    if (node_box_distance_00 <= this->visitor_->nn_->distance) {
      if (fVar1 < fVar12) {
        node_00 = pkVar5;
      }
      (this->node_box_offset_).elems_._M_elems[iVar3] = fVar11;
      search_nearest(this,node_00,node_box_distance_00);
      (this->node_box_offset_).elems_._M_elems[iVar3] = fVar2;
    }
  }
  return;
}

Assistant:

inline void search_nearest(
      node_type const* const node, scalar_type node_box_distance) {
    if (node->is_leaf()) {
      auto begin = indices_.begin() + node->data.leaf.begin_idx;
      auto const end = indices_.begin() + node->data.leaf.end_idx;
      for (; begin < end; ++begin) {
        visitor_(*begin, metric_(query_.begin(), query_.end(), space_[*begin]));
      }
    } else {
      // Go left or right and then check if we should still go down the other
      // side based on the current minimum distance.
      size_t const split_dim = static_cast<size_t>(node->data.branch.split_dim);
      scalar_type const v = query_[split_dim];
      scalar_type new_offset;
      node_type const* node_1st;
      node_type const* node_2nd;

      // On equals we would possibly need to go left as well. However, this is
      // handled by the if statement below this one: the check that max search
      // radius still hits the split value after having traversed the first
      // branch.
      // If left_max - v > 0, this means that the query is inside the left node,
      // if right_min - v < 0 it's inside the right one. For the area in between
      // we just pick the closest one by summing them.
      if ((node->data.branch.left_max + node->data.branch.right_min - v - v) >
          0) {
        node_1st = node->left;
        node_2nd = node->right;
        new_offset = metric_(node->data.branch.right_min - v);
      } else {
        node_1st = node->right;
        node_2nd = node->left;
        new_offset = metric_(node->data.branch.left_max - v);
      }

      // The distance and offset for node_1st is the same as that of its parent.
      search_nearest(node_1st, node_box_distance);

      // Calculate the distance to node_2nd.
      // NOTE: This method only works with Lp norms to which the exponent is not
      // applied.
      scalar_type const old_offset = node_box_offset_[split_dim];
      node_box_distance = node_box_distance - old_offset + new_offset;

      // The value visitor->max() contains the current nearest neighbor distance
      // or otherwise current maximum search distance. When testing against the
      // split value we determine if we should go into the neighboring node.
      if (visitor_.max() >= node_box_distance) {
        node_box_offset_[split_dim] = new_offset;
        search_nearest(node_2nd, node_box_distance);
        node_box_offset_[split_dim] = old_offset;
      }
    }
  }